

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

int __thiscall Minisat::Solver::getRestartLevel(Solver *this)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  uint32_t uVar8;
  uint bLevel;
  Heap<Minisat::Solver::VarOrderLt> *this_00;
  long lVar9;
  long lVar10;
  
  uVar8 = (this->restart).selection_type;
  if (uVar8 != 0) {
    if (uVar8 == 4) {
      if ((this->trail_lim).sz == 0) {
LAB_00116e42:
        uVar8 = 0;
      }
      else {
        iVar5 = rand();
        uVar8 = iVar5 % (this->trail_lim).sz;
      }
    }
    else {
      if (uVar8 != 3) {
        lVar10 = 0x288;
        if (VSIDS_DISTANCE < this->current_heuristic) {
          lVar10 = (ulong)(this->current_heuristic != CHB) * 0x20 + 0x278;
        }
        iVar5 = -1;
        do {
          while (((iVar5 == -1 ||
                  (lVar9 = (long)iVar5, ((this->assigns).data[lVar9].value & 2) == 0)) ||
                 ((this->decision).data[lVar9] == '\0'))) {
            if ((this->order_heap->heap).sz == 0) goto LAB_00116e42;
            iVar5 = Heap<Minisat::Solver::VarOrderLt>::removeMin(this->order_heap);
          }
          lVar7 = (long)(this->trail_lim).sz;
          bLevel = 0;
          if (0 < lVar7) {
            lVar3 = *(long *)((long)&this->_vptr_Solver + lVar10);
            dVar2 = *(double *)(lVar3 + lVar9 * 8);
            lVar9 = 0;
            do {
              pdVar1 = (double *)
                       (lVar3 + (long)((this->trail).data[(this->trail_lim).data[lVar9]].x >> 1) * 8
                       );
              if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
                bLevel = (uint)lVar9;
                break;
              }
              lVar9 = lVar9 + 1;
            } while (lVar7 != lVar9);
          }
          Heap<Minisat::Solver::VarOrderLt>::insert(this->order_heap,iVar5);
          if ((bLevel == 0) || ((this->restart).selection_type < 2)) {
            if (bLevel == 0) goto LAB_00116e42;
            goto LAB_00116dec;
          }
          cancelUntil(this,bLevel,false);
          iVar5 = -1;
          while (((iVar5 == -1 ||
                  (lVar9 = (long)iVar5, ((this->assigns).data[lVar9].value & 2) == 0)) ||
                 ((this->decision).data[lVar9] == '\0'))) {
            this_00 = this->order_heap;
            if ((this_00->heap).sz == 0) {
              iVar5 = -1;
              goto LAB_00116de7;
            }
            iVar5 = Heap<Minisat::Solver::VarOrderLt>::removeMin(this_00);
          }
          if (*(double *)(*(long *)((long)&this->_vptr_Solver + lVar10) + lVar9 * 8) <=
              (double)((this->trail).data[(this->trail_lim).data[(ulong)bLevel - 1]].x >> 1))
          goto code_r0x00116dd7;
        } while( true );
      }
      uVar8 = (this->trail_lim).sz;
    }
  }
  return uVar8;
code_r0x00116dd7:
  this_00 = this->order_heap;
LAB_00116de7:
  Heap<Minisat::Solver::VarOrderLt>::insert(this_00,iVar5);
LAB_00116dec:
  (this->restart).savedDecisions = (this->restart).savedDecisions + (ulong)bLevel;
  piVar4 = (this->trail_lim).data;
  piVar6 = piVar4 + bLevel;
  if (bLevel == (this->trail_lim).sz) {
    piVar6 = &(this->trail).sz;
  }
  (this->restart).savedPropagations =
       ((long)*piVar6 - (long)*piVar4) + (this->restart).savedPropagations;
  (this->restart).partialRestarts = (this->restart).partialRestarts + 1;
  return bLevel;
}

Assistant:

int Solver::getRestartLevel()
{
    // stay on the current level?
    if (restart.selection_type == 3) return decisionLevel();
    if (restart.selection_type == 4) return decisionLevel() == 0 ? 0 : rand() % decisionLevel();

    if (restart.selection_type >= 1) {

        bool repeatReusedTrail = false;
        Var next = var_Undef;
        int restartLevel = 0;

        const vec<double> &restart_activity = usesVSIDS() ? activity_VSIDS : (usesCHB() ? activity_CHB : activity_distance);

        do {
            repeatReusedTrail = false; // get it right this time?

            // Activity based selection
            while (next == var_Undef || value(next) != l_Undef ||
                   !decision[next]) // found a yet unassigned variable with the highest activity among the unassigned variables
                if (order_heap->empty()) {
                    // we cannot compare to any other variable, hence, we have SAT already
                    return 0;
                } else {
                    next = order_heap->removeMin(); // get next element
                }

            // based on variable next, either check for reusedTrail, or matching Trail!
            // activity of the next decision literal
            restartLevel = 0;
            for (int i = 0; i < decisionLevel(); ++i) {
                if (restart_activity[var(trail[trail_lim[i]])] < restart_activity[next]) {
                    restartLevel = i;
                    break;
                }
            }
            // put the decision literal back, so that it can be used for the next decision
            order_heap->insert(next);

            // reused trail
            if (restart.selection_type > 1 && restartLevel > 0) { // check whether jumping higher would be "more correct"
                cancelUntil(restartLevel);
                Var more = var_Undef;
                while (more == var_Undef || value(more) != l_Undef || !decision[more])
                    if (order_heap->empty()) {
                        more = var_Undef;
                        break;
                    } else {
                        more = order_heap->removeMin();
                    }

                // actually, would have to jump higher than the current level!
                if (more != var_Undef && restart_activity[more] > var(trail[trail_lim[restartLevel - 1]])) {
                    repeatReusedTrail = true;
                    next = more; // no need to insert, and get back afterwards again!
                } else {
                    order_heap->insert(more);
                }
            }
        } while (repeatReusedTrail);

        // stats
        if (restartLevel > 0) { // if a partial restart is done
            restart.savedDecisions += restartLevel;
            const int thisPropSize = restartLevel == decisionLevel() ? trail.size() : trail_lim[restartLevel];
            restart.savedPropagations += (thisPropSize - trail_lim[0]); // number of literals that do not need to be propagated
            restart.partialRestarts++;
        }

        // return restart level
        return restartLevel;
    }
    return 0;
}